

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void qDeleteAll<QList<DomActionGroup*>::const_iterator>(const_iterator begin,const_iterator end)

{
  DomActionGroup *this;
  
  if (begin.i != end.i) {
    do {
      this = *begin.i;
      if (this != (DomActionGroup *)0x0) {
        DomActionGroup::~DomActionGroup(this);
      }
      operator_delete(this,0x80);
      begin.i = begin.i + 1;
    } while (begin.i != end.i);
  }
  return;
}

Assistant:

inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }